

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyFromParentKeyRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyFromParentKeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentKeyRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  CreateExtkeyResponseStruct response;
  CreateExtkeyFromParentKeyRequestStruct request;
  CreateExtkeyResponse res;
  CreateExtkeyFromParentKeyRequest req;
  string local_348;
  CreateExtkeyResponseStruct local_328;
  CreateExtkeyFromParentKeyRequestStruct local_260;
  ErrorResponse local_1a0;
  CreateExtkeyFromParentKeyRequest local_e8;
  
  CreateExtkeyFromParentKeyRequest::CreateExtkeyFromParentKeyRequest(&local_e8);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentKeyRequest>::Deserialize
            (&local_e8.super_JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentKeyRequest>,
             (string *)this);
  CreateExtkeyFromParentKeyRequest::ConvertToStruct(&local_260,&local_e8);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_328,request_message,&local_260);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_328.error.code == 0) {
      CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)&local_1a0);
      CreateExtkeyResponse::ConvertFromStruct((CreateExtkeyResponse *)&local_1a0,&local_328);
      core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_
                (&local_348,(JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> *)&local_1a0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)&local_1a0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1a0,&local_328.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_348,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1a0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      local_1a0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_1a0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1a0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_328.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_328.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.error.message._M_dataplus._M_p != &local_328.error.message.field_2) {
      operator_delete(local_328.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.error.type._M_dataplus._M_p != &local_328.error.type.field_2) {
      operator_delete(local_328.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.extkey._M_dataplus._M_p != &local_328.extkey.field_2) {
      operator_delete(local_328.extkey._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_260.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.parent_chain_code._M_dataplus._M_p != &local_260.parent_chain_code.field_2) {
      operator_delete(local_260.parent_chain_code._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.parent_key._M_dataplus._M_p != &local_260.parent_key.field_2) {
      operator_delete(local_260.parent_key._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.extkey_type._M_dataplus._M_p != &local_260.extkey_type.field_2) {
      operator_delete(local_260.extkey_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.network._M_dataplus._M_p != &local_260.network.field_2) {
      operator_delete(local_260.network._M_dataplus._M_p);
    }
    CreateExtkeyFromParentKeyRequest::~CreateExtkeyFromParentKeyRequest(&local_e8);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)&local_1a0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct(&local_328);
  CreateExtkeyFromParentKeyRequestStruct::~CreateExtkeyFromParentKeyRequestStruct(&local_260);
  CreateExtkeyFromParentKeyRequest::~CreateExtkeyFromParentKeyRequest(&local_e8);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}